

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinger.c
# Opt level: O0

Pinger * pinger_new(Conf *conf,Backend *backend)

{
  int iVar1;
  Pinger *pinger_00;
  Pinger *pinger;
  Backend *backend_local;
  Conf *conf_local;
  
  pinger_00 = (Pinger *)safemalloc(1,0x20,0);
  iVar1 = conf_get_int(conf,6);
  pinger_00->interval = iVar1;
  pinger_00->pending = false;
  pinger_00->backend = backend;
  pinger_schedule(pinger_00);
  return pinger_00;
}

Assistant:

Pinger *pinger_new(Conf *conf, Backend *backend)
{
    Pinger *pinger = snew(Pinger);

    pinger->interval = conf_get_int(conf, CONF_ping_interval);
    pinger->pending = false;
    pinger->backend = backend;
    pinger_schedule(pinger);

    return pinger;
}